

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_attention.h
# Opt level: O0

void __thiscall
shift_window_transformer::WindowAttention<float>::WindowAttention
          (WindowAttention<float> *this,int dim,int heads,int headDim,bool shifted,int windowSize,
          bool relativePosEmbedding)

{
  bool bVar1;
  int displacement_00;
  result_type_conflict rVar2;
  Linear<float> *pLVar3;
  CyclicShift<float> *pCVar4;
  Tensor<float> *pTVar5;
  Tensor<int> *pTVar6;
  double dVar7;
  result_type rVar8;
  int local_27a8;
  int local_27a4;
  float local_27a0;
  int local_279c;
  int local_2798;
  int cnt_1;
  float local_2790;
  int local_278c;
  reference piStack_2788;
  int cnt;
  int *item;
  iterator __end3;
  iterator __begin3;
  Tensor<int> *__range3;
  normal_distribution<double> d;
  mt19937 gen;
  random_device rd;
  int displacement;
  bool relativePosEmbedding_local;
  int windowSize_local;
  bool shifted_local;
  int headDim_local;
  int heads_local;
  int dim_local;
  WindowAttention<float> *this_local;
  
  Layer<float>::Layer((Layer<float> *)this);
  *(undefined ***)this = &PTR_forward_0011ca70;
  *(undefined ***)this = &PTR_forward_0011ca70;
  this->cyclicShift = (CyclicShift<float> *)0x0;
  this->cyclicBackShift = (CyclicShift<float> *)0x0;
  this->qLinear = (Linear<float> *)0x0;
  this->kLinear = (Linear<float> *)0x0;
  this->vLinear = (Linear<float> *)0x0;
  this->outLinear = (Linear<float> *)0x0;
  this->upperLowerMask = (Tensor<float> *)0x0;
  this->leftRightMask = (Tensor<float> *)0x0;
  this->relativeIndices = (Tensor<int> *)0x0;
  this->posEmbedding = (Tensor<float> *)0x0;
  SoftMax<float>::SoftMax(&this->softMax);
  this->windowSize = windowSize;
  this->shifted = shifted;
  this->innerDim = heads * headDim;
  this->headDim = headDim;
  this->heads = heads;
  dVar7 = sqrt((double)headDim);
  this->scale = (float)(1.0 / dVar7);
  this->relativePosEmbedding = relativePosEmbedding;
  pLVar3 = (Linear<float> *)operator_new(0x28);
  Linear<float>::Linear(pLVar3,dim,heads * headDim,false);
  this->qLinear = pLVar3;
  pLVar3 = (Linear<float> *)operator_new(0x28);
  Linear<float>::Linear(pLVar3,dim,heads * headDim,false);
  this->kLinear = pLVar3;
  pLVar3 = (Linear<float> *)operator_new(0x28);
  Linear<float>::Linear(pLVar3,dim,heads * headDim,false);
  this->vLinear = pLVar3;
  pLVar3 = (Linear<float> *)operator_new(0x28);
  Linear<float>::Linear(pLVar3,heads * headDim,dim);
  this->outLinear = pLVar3;
  if (shifted) {
    displacement_00 = windowSize / 2;
    pCVar4 = (CyclicShift<float> *)operator_new(0x10);
    CyclicShift<float>::CyclicShift(pCVar4,-displacement_00);
    this->cyclicShift = pCVar4;
    pCVar4 = (CyclicShift<float> *)operator_new(0x10);
    CyclicShift<float>::CyclicShift(pCVar4,displacement_00);
    this->cyclicBackShift = pCVar4;
    pTVar5 = create_mask<float>(windowSize,displacement_00,true,false);
    this->upperLowerMask = pTVar5;
    pTVar5 = create_mask<float>(windowSize,displacement_00,false,true);
    this->leftRightMask = pTVar5;
  }
  std::random_device::random_device((random_device *)&gen._M_p);
  rVar2 = std::random_device::operator()((random_device *)&gen._M_p);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine
            ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              *)&d._M_saved_available,(ulong)rVar2);
  std::normal_distribution<double>::normal_distribution
            ((normal_distribution<double> *)&__range3,0.0,1.0);
  if (relativePosEmbedding) {
    pTVar6 = get_relative_distances<int>(windowSize);
    this->relativeIndices = pTVar6;
    pTVar6 = this->relativeIndices;
    __end3 = std::vector<int,_std::allocator<int>_>::begin
                       (&pTVar6->super_vector<int,_std::allocator<int>_>);
    item = (int *)std::vector<int,_std::allocator<int>_>::end
                            (&pTVar6->super_vector<int,_std::allocator<int>_>);
    while( true ) {
      bVar1 = __gnu_cxx::operator==<int_*,_std::vector<int,_std::allocator<int>_>_>
                        (&__end3,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                  *)&item);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      piStack_2788 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                     operator*(&__end3);
      *piStack_2788 = *piStack_2788 + windowSize + -1;
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&__end3);
    }
    pTVar5 = (Tensor<float> *)operator_new(0x30);
    Tensor<float>::Tensor(pTVar5);
    this->posEmbedding = pTVar5;
    local_278c = (windowSize * 2 + -1) * (windowSize * 2 + -1);
    while (0 < local_278c) {
      pTVar5 = this->posEmbedding;
      local_278c = local_278c + -1;
      rVar8 = std::normal_distribution<double>::operator()
                        ((normal_distribution<double> *)&__range3,
                         (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                          *)&d._M_saved_available);
      local_2790 = (float)rVar8;
      std::vector<float,_std::allocator<float>_>::push_back
                (&pTVar5->super_vector<float,_std::allocator<float>_>,&local_2790);
    }
    cnt_1 = windowSize * 2 + -1;
    local_278c = local_278c + -1;
    std::vector<int,_std::allocator<int>_>::push_back(&this->posEmbedding->shape,&cnt_1);
    local_2798 = windowSize * 2 + -1;
    std::vector<int,_std::allocator<int>_>::push_back(&this->posEmbedding->shape,&local_2798);
  }
  else {
    pTVar5 = (Tensor<float> *)operator_new(0x30);
    Tensor<float>::Tensor(pTVar5);
    this->posEmbedding = pTVar5;
    local_279c = windowSize * windowSize * windowSize * windowSize;
    while (0 < local_279c) {
      pTVar5 = this->posEmbedding;
      local_279c = local_279c + -1;
      rVar8 = std::normal_distribution<double>::operator()
                        ((normal_distribution<double> *)&__range3,
                         (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                          *)&d._M_saved_available);
      local_27a0 = (float)rVar8;
      std::vector<float,_std::allocator<float>_>::push_back
                (&pTVar5->super_vector<float,_std::allocator<float>_>,&local_27a0);
    }
    local_27a4 = windowSize * windowSize;
    local_279c = local_279c + -1;
    std::vector<int,_std::allocator<int>_>::push_back(&this->posEmbedding->shape,&local_27a4);
    local_27a8 = windowSize * windowSize;
    std::vector<int,_std::allocator<int>_>::push_back(&this->posEmbedding->shape,&local_27a8);
  }
  std::random_device::~random_device((random_device *)&gen._M_p);
  return;
}

Assistant:

WindowAttention(int dim, int heads, int headDim, bool shifted, int windowSize, bool relativePosEmbedding)
                : shifted(shifted),
                  scale(1 / sqrt(headDim)),
                  innerDim(heads * headDim),
                  heads(heads),
                  headDim(headDim),
                  windowSize(windowSize),
                  relativePosEmbedding(relativePosEmbedding) {
            qLinear = new Linear<T>(dim, heads * headDim, false);
            kLinear = new Linear<T>(dim, heads * headDim, false);
            vLinear = new Linear<T>(dim, heads * headDim, false);
            outLinear = new Linear<T>(heads * headDim, dim);
            if (shifted) {
                int displacement = windowSize / 2;
                cyclicShift = new CyclicShift<T>(-displacement);
                cyclicBackShift = new CyclicShift<T>(displacement);
                upperLowerMask = create_mask<T>(windowSize, displacement, true, false);
                leftRightMask = create_mask<T>(windowSize, displacement, false, true);
            }
            std::random_device rd{};
            std::mt19937 gen{rd()};
            std::normal_distribution<> d{0, 1};
            if (relativePosEmbedding) {
                relativeIndices = get_relative_distances<int>(windowSize);
                for (auto &item: *relativeIndices) {
                    item = item + windowSize - 1;
                }
                posEmbedding = new Tensor<T>();
                int cnt = (2 * windowSize - 1) * (2 * windowSize - 1);
                while (cnt-- > 0) {
                    posEmbedding->push_back((T) d(gen));
                }
                posEmbedding->shape.push_back(2 * windowSize - 1);
                posEmbedding->shape.push_back(2 * windowSize - 1);
            } else {
                posEmbedding = new Tensor<T>();
                int cnt = windowSize * windowSize * windowSize * windowSize;
                while (cnt-- > 0) {
                    posEmbedding->push_back((T) d(gen));
                }
                posEmbedding->shape.push_back(windowSize * windowSize);
                posEmbedding->shape.push_back(windowSize * windowSize);
            }
        }